

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O1

bool __thiscall ImportBaseDirWrapper::wrap(ImportBaseDirWrapper *this)

{
  size_t sVar1;
  pointer ppEVar2;
  ExeNodeWrapper *pEVar3;
  QArrayData *pQVar4;
  long lVar5;
  int iVar6;
  IMAGE_DATA_DIRECTORY *pIVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])();
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])(this);
  sVar1 = this->importsCount;
  this->importsCount = 0;
  this->invalidEntries = 0;
  pIVar7 = DataDirEntryWrapper::getDataDirectory(&this->super_DataDirEntryWrapper);
  if (pIVar7 == (IMAGE_DATA_DIRECTORY *)0x0) {
    sVar10 = this->importsCount;
  }
  else {
    uVar9 = 0;
    sVar10 = 0;
    do {
      iVar6 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2e])
                        (this,sVar10);
      if ((char)iVar6 == '\0') goto LAB_0012fb8b;
      ppEVar2 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries.
                super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                        entries.
                        super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) <= sVar10) {
        pcVar8 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   sVar10);
        if (*(long *)(pcVar8 + 0xa0) == 0) {
          pQVar4 = *(QArrayData **)(pcVar8 + 0x80);
          lVar5 = *(long *)(pcVar8 + 0x90);
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          bVar11 = lVar5 != 0;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,8,8);
            }
          }
        }
        else {
          bVar11 = false;
        }
        return bVar11;
      }
      pEVar3 = ppEVar2[sVar10];
      if (pEVar3 == (ExeNodeWrapper *)0x0) {
        bVar11 = false;
      }
      else {
        iVar6 = (*(pEVar3->super_ExeElementWrapper).super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0x2b])();
        if ((char)iVar6 == '\0') {
          this->invalidEntries = this->invalidEntries + 1;
          uVar9 = uVar9 + 1;
          bVar11 = uVar9 < 100;
        }
        else {
          bVar11 = true;
          uVar9 = 0;
        }
      }
      if (!bVar11) goto LAB_0012fb8b;
      sVar10 = sVar10 + 1;
    } while (sVar10 != 0xffffffffffffffff);
    sVar10 = 0xffffffffffffffff;
LAB_0012fb8b:
    this->importsCount = sVar10;
  }
  return sVar1 != sVar10;
}

Assistant:

bool ImportBaseDirWrapper::wrap()
{
    clearMapping();
    clear();

    size_t oldCount = this->importsCount;
    this->importsCount = 0;
    this->invalidEntries = 0;
    
    if (!getDataDirectory()) {
        return (oldCount != this->importsCount); //has count changed
    }

    const size_t LIMIT = (-1);
    const size_t INVALID_LIMIT = 100;
    size_t cntr = 0;
    size_t invalidSeries = 0;
    for (cntr = 0; cntr < LIMIT; cntr++) {
        if (loadNextEntry(cntr) == false) break;
        ExeNodeWrapper* entry = this->entries.at(cntr);
        if (!entry) break;
        if (entry->isValid()) {
            invalidSeries = 0;
        }
        else {
            invalidSeries++;
            this->invalidEntries++;
            if (invalidSeries >= INVALID_LIMIT) break;
        }
    }

    this->importsCount = cntr;
    return (oldCount != this->importsCount); //has count changed
}